

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

lzma_ret stream_encoder_mt_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_mt *options)

{
  lzma_bool lVar1;
  lzma_ret lVar2;
  int iVar3;
  uint64_t uVar4;
  lzma_stream_coder_conflict1 *coder;
  worker_thread *pwVar5;
  lzma_index *plVar6;
  lzma_filter *plVar7;
  lzma_filter *filters;
  uint64_t outbuf_size_max;
  uint64_t block_size;
  lzma_options_easy easy;
  lzma_filter *local_110;
  mythread_mutex *local_108;
  uint64_t local_100;
  size_t local_f8;
  lzma_options_easy local_f0;
  
  if ((code *)next->init != stream_encoder_mt_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)stream_encoder_mt_init;
  lVar2 = get_options(options,&local_f0,&local_110,&local_f8,&local_100);
  if (lVar2 != LZMA_OK) {
    return lVar2;
  }
  uVar4 = lzma_raw_encoder_memusage(local_110);
  if (uVar4 == 0xffffffffffffffff) {
    return LZMA_OPTIONS_ERROR;
  }
  if (0xf < options->check) {
    return LZMA_PROG_ERROR;
  }
  lVar1 = lzma_check_is_supported(options->check);
  if (lVar1 == '\0') {
    return LZMA_UNSUPPORTED_CHECK;
  }
  coder = (lzma_stream_coder_conflict1 *)next->coder;
  if (coder != (lzma_stream_coder_conflict1 *)0x0) {
LAB_0068a844:
    coder->sequence = SEQ_STREAM_HEADER;
    coder->block_size = local_f8;
    coder->thread_error = LZMA_OK;
    coder->thr = (worker_thread *)0x0;
    if (options->threads == 0) {
      __assert_fail("options->threads > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0x3fb,
                    "lzma_ret stream_encoder_mt_init(lzma_next_coder *, const lzma_allocator *, const lzma_mt *)"
                   );
    }
    if (coder->threads_max == options->threads) {
      threads_stop(coder,true);
    }
    else {
      threads_end(coder,allocator);
      coder->threads = (worker_thread *)0x0;
      coder->threads_max = 0;
      coder->threads_initialized = 0;
      coder->threads_free = (worker_thread *)0x0;
      pwVar5 = (worker_thread *)lzma_alloc((ulong)options->threads * 0x1c0,allocator);
      coder->threads = pwVar5;
      if (pwVar5 == (worker_thread *)0x0) {
        return LZMA_MEM_ERROR;
      }
      coder->threads_max = options->threads;
    }
    lVar2 = lzma_outq_init(&coder->outq,allocator,local_100,options->threads);
    if (lVar2 != LZMA_OK) {
      return lVar2;
    }
    coder->timeout = options->timeout;
    if (coder->filters[0].id != 0xffffffffffffffff) {
      plVar7 = coder->filters;
      do {
        plVar7 = plVar7 + 1;
        lzma_free(plVar7[-1].options,allocator);
      } while (plVar7->id != 0xffffffffffffffff);
    }
    lVar2 = lzma_filters_copy(local_110,coder->filters,allocator);
    if (lVar2 != LZMA_OK) {
      return lVar2;
    }
    lzma_index_end(coder->index,allocator);
    plVar6 = lzma_index_init(allocator);
    coder->index = plVar6;
    if (plVar6 == (lzma_index *)0x0) {
      return LZMA_MEM_ERROR;
    }
    (coder->stream_flags).version = 0;
    (coder->stream_flags).check = options->check;
    lVar2 = lzma_stream_header_encode(&coder->stream_flags,coder->header);
    if (lVar2 == LZMA_OK) {
      coder->header_pos = 0;
      coder->progress_in = 0;
      coder->progress_out = 0xc;
      return LZMA_OK;
    }
    return lVar2;
  }
  coder = (lzma_stream_coder_conflict1 *)lzma_alloc(0x1c0,allocator);
  if (coder == (lzma_stream_coder_conflict1 *)0x0) {
    return LZMA_MEM_ERROR;
  }
  next->coder = coder;
  local_108 = &coder->mutex;
  iVar3 = pthread_mutex_init((pthread_mutex_t *)local_108,(pthread_mutexattr_t *)0x0);
  if (iVar3 == 0) {
    iVar3 = pthread_cond_init((pthread_cond_t *)&coder->cond,(pthread_condattr_t *)0x0);
    if (iVar3 == 0) {
      next->code = stream_encode_mt;
      next->end = stream_encoder_mt_end;
      next->get_progress = get_progress;
      coder->filters[0].id = 0xffffffffffffffff;
      (coder->index_encoder).id = 0xffffffffffffffff;
      (coder->index_encoder).init = 0;
      (coder->index_encoder).code = (lzma_code_function)0x0;
      (coder->index_encoder).end = (lzma_end_function)0x0;
      (coder->index_encoder).get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
      (coder->index_encoder).get_check = (_func_lzma_check_void_ptr *)0x0;
      (coder->index_encoder).memconfig =
           (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
      (coder->index_encoder).update =
           (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
      coder->index = (lzma_index *)0x0;
      (coder->index_encoder).coder = (void *)0x0;
      (coder->outq).bufs = (lzma_outbuf *)0x0;
      (coder->outq).bufs_mem = (uint8_t *)0x0;
      (coder->outq).buf_size_max = 0;
      (coder->outq).bufs_allocated = 0;
      (coder->outq).bufs_pos = 0;
      *(undefined8 *)&(coder->outq).bufs_used = 0;
      (coder->outq).read_pos = 0;
      coder->threads = (worker_thread *)0x0;
      coder->threads_max = 0;
      coder->threads_initialized = 0;
      goto LAB_0068a844;
    }
    mythread_mutex_destroy(local_108);
  }
  lzma_free(coder,allocator);
  next->coder = (void *)0x0;
  return LZMA_MEM_ERROR;
}

Assistant:

static lzma_ret
stream_encoder_mt_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_mt *options)
{
	lzma_next_coder_init(&stream_encoder_mt_init, next, allocator);

	// Get the filter chain.
	lzma_options_easy easy;
	const lzma_filter *filters;
	uint64_t block_size;
	uint64_t outbuf_size_max;
	return_if_error(get_options(options, &easy, &filters,
			&block_size, &outbuf_size_max));

#if SIZE_MAX < UINT64_MAX
	if (block_size > SIZE_MAX)
		return LZMA_MEM_ERROR;
#endif

	// Validate the filter chain so that we can give an error in this
	// function instead of delaying it to the first call to lzma_code().
	// The memory usage calculation verifies the filter chain as
	// a side effect so we take advantage of that.
	if (lzma_raw_encoder_memusage(filters) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// Validate the Check ID.
	if ((unsigned int)(options->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(options->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Allocate and initialize the base structure if needed.
	lzma_stream_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_stream_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;

		// For the mutex and condition variable initializations
		// the error handling has to be done here because
		// stream_encoder_mt_end() doesn't know if they have
		// already been initialized or not.
		if (mythread_mutex_init(&coder->mutex)) {
			lzma_free(coder, allocator);
			next->coder = NULL;
			return LZMA_MEM_ERROR;
		}

		if (mythread_cond_init(&coder->cond)) {
			mythread_mutex_destroy(&coder->mutex);
			lzma_free(coder, allocator);
			next->coder = NULL;
			return LZMA_MEM_ERROR;
		}

		next->code = &stream_encode_mt;
		next->end = &stream_encoder_mt_end;
		next->get_progress = &get_progress;
// 		next->update = &stream_encoder_mt_update;

		coder->filters[0].id = LZMA_VLI_UNKNOWN;
		coder->index_encoder = LZMA_NEXT_CODER_INIT;
		coder->index = NULL;
		memzero(&coder->outq, sizeof(coder->outq));
		coder->threads = NULL;
		coder->threads_max = 0;
		coder->threads_initialized = 0;
	}

	// Basic initializations
	coder->sequence = SEQ_STREAM_HEADER;
	coder->block_size = (size_t)(block_size);
	coder->thread_error = LZMA_OK;
	coder->thr = NULL;

	// Allocate the thread-specific base structures.
	assert(options->threads > 0);
	if (coder->threads_max != options->threads) {
		threads_end(coder, allocator);

		coder->threads = NULL;
		coder->threads_max = 0;

		coder->threads_initialized = 0;
		coder->threads_free = NULL;

		coder->threads = lzma_alloc(
				options->threads * sizeof(worker_thread),
				allocator);
		if (coder->threads == NULL)
			return LZMA_MEM_ERROR;

		coder->threads_max = options->threads;
	} else {
		// Reuse the old structures and threads. Tell the running
		// threads to stop and wait until they have stopped.
		threads_stop(coder, true);
	}

	// Output queue
	return_if_error(lzma_outq_init(&coder->outq, allocator,
			outbuf_size_max, options->threads));

	// Timeout
	coder->timeout = options->timeout;

	// Free the old filter chain and copy the new one.
	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	return_if_error(lzma_filters_copy(
			filters, coder->filters, allocator));

	// Index
	lzma_index_end(coder->index, allocator);
	coder->index = lzma_index_init(allocator);
	if (coder->index == NULL)
		return LZMA_MEM_ERROR;

	// Stream Header
	coder->stream_flags.version = 0;
	coder->stream_flags.check = options->check;
	return_if_error(lzma_stream_header_encode(
			&coder->stream_flags, coder->header));

	coder->header_pos = 0;

	// Progress info
	coder->progress_in = 0;
	coder->progress_out = LZMA_STREAM_HEADER_SIZE;

	return LZMA_OK;
}